

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_max_min(void)

{
  bitset_t *bitset;
  size_t sVar1;
  size_t k;
  bitset_t *b;
  size_t in_stack_ffffffffffffffe8;
  bitset_t *bitset_00;
  
  bitset = bitset_create();
  bitset_00 = (bitset_t *)0x64;
  while( true ) {
    if ((bitset_t *)0x3e7 < bitset_00) {
      bitset_free((bitset_t *)0x10169e);
      return;
    }
    bitset_set(bitset_00,in_stack_ffffffffffffffe8);
    sVar1 = bitset_minimum(bitset);
    if (sVar1 != 300) break;
    sVar1 = bitset_maximum(bitset);
    if (sVar1 != (long)bitset_00 * 3) {
      fprintf(_stderr,"Assertion failed in %s at line %d\n","test_max_min",0x3f);
      exit(1);
    }
    bitset_00 = (bitset_t *)((long)&bitset_00->array + 1);
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_max_min",0x3e);
  exit(1);
}

Assistant:

void test_max_min() {
  bitset_t *b = bitset_create();
  for (size_t k = 100; k < 1000; ++k) {
    bitset_set(b, 3 * k);
    TEST_ASSERT(bitset_minimum(b) == 3 * 100);
    TEST_ASSERT(bitset_maximum(b) == 3 * k);
  }
  bitset_free(b);
}